

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenIndex BinaryenBlockAppendChild(BinaryenExpressionRef expr,BinaryenExpressionRef childExpr)

{
  uintptr_t uVar1;
  
  if (expr->_id != BlockId) {
    __assert_fail("expression->is<Block>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x7fe,
                  "BinaryenIndex BinaryenBlockAppendChild(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (childExpr != (BinaryenExpressionRef)0x0) {
    uVar1 = expr[2].type.id;
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)(expr + 2),
               childExpr);
    return (BinaryenIndex)uVar1;
  }
  __assert_fail("childExpr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x7ff,
                "BinaryenIndex BinaryenBlockAppendChild(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

BinaryenIndex BinaryenBlockAppendChild(BinaryenExpressionRef expr,
                                       BinaryenExpressionRef childExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Block>());
  assert(childExpr);
  auto& list = static_cast<Block*>(expression)->list;
  auto index = list.size();
  list.push_back((Expression*)childExpr);
  return index;
}